

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O0

void HTS_mc2b(double *mc,double *b,int m,double a)

{
  int in_EDX;
  double *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  int local_14;
  
  if (in_RDI == in_RSI) {
    if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
      for (local_14 = in_EDX + -1; -1 < local_14; local_14 = local_14 + -1) {
        in_RSI[local_14] = -in_XMM0_Qa * in_RSI[local_14 + 1] + in_RSI[local_14];
      }
    }
  }
  else if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
    in_RSI[in_EDX] = in_RDI[in_EDX];
    for (local_14 = in_EDX + -1; -1 < local_14; local_14 = local_14 + -1) {
      in_RSI[local_14] = -in_XMM0_Qa * in_RSI[local_14 + 1] + in_RDI[local_14];
    }
  }
  else {
    HTS_movem(in_RDI,in_RSI,in_EDX + 1);
  }
  return;
}

Assistant:

static void HTS_mc2b(double *mc, double *b, int m, const double a)
{
   if (mc != b) {
      if (a != 0.0) {
         b[m] = mc[m];
         for (m--; m >= 0; m--)
            b[m] = mc[m] - a * b[m + 1];
      } else
         HTS_movem(mc, b, m + 1);
   } else if (a != 0.0)
      for (m--; m >= 0; m--)
         b[m] -= a * b[m + 1];
}